

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# readam.c
# Opt level: O0

DUH * dumb_read_riff_am(DUMBFILE *f,riff *stream)

{
  DUMB_IT_SIGDATA *desc;
  undefined8 in_RSI;
  int n_signals;
  char *(*in_RDI) [2];
  char *tag [2] [2];
  DUH_SIGTYPE_DESC *descptr;
  sigdata_t *sigdata;
  riff *in_stack_00000050;
  DUMBFILE *in_stack_00000058;
  DUH_SIGTYPE_DESC *sigdata_00;
  undefined8 in_stack_fffffffffffffff8;
  DUH *pDVar1;
  
  n_signals = (int)((ulong)in_RSI >> 0x20);
  sigdata_00 = &_dumb_sigtype_it;
  desc = it_riff_am_load_sigdata(in_stack_00000058,in_stack_00000050);
  if (desc == (DUMB_IT_SIGDATA *)0x0) {
    pDVar1 = (DUH *)0x0;
  }
  else {
    pDVar1 = make_duh((int32)((ulong)in_stack_fffffffffffffff8 >> 0x20),
                      (int)in_stack_fffffffffffffff8,in_RDI,n_signals,(DUH_SIGTYPE_DESC **)desc,
                      (sigdata_t **)sigdata_00);
  }
  return pDVar1;
}

Assistant:

DUH *dumb_read_riff_am( DUMBFILE * f, struct riff * stream )
{
	sigdata_t *sigdata;

	DUH_SIGTYPE_DESC *descptr = &_dumb_sigtype_it;

    sigdata = it_riff_am_load_sigdata( f, stream );

	if (!sigdata)
		return NULL;

	{
		const char *tag[2][2];
		tag[0][0] = "TITLE";
        tag[0][1] = (const char *)(((DUMB_IT_SIGDATA *)sigdata)->name);
		tag[1][0] = "FORMAT";
		tag[1][1] = "RIFF AM";
		return make_duh( -1, 2, ( const char * const (*) [ 2 ] ) tag, 1, & descptr, & sigdata );
	}
}